

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

ostream * despot::operator<<(ostream *os,Function *func)

{
  value_type pNVar1;
  NamedVar *this;
  bool bVar2;
  size_type sVar3;
  const_reference ppNVar4;
  string *psVar5;
  ostream *poVar6;
  ulong uVar7;
  reference pvVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  pointer ppVar12;
  char *pcVar13;
  _Self local_e8;
  _Self local_e0;
  const_iterator it;
  int local_bc;
  undefined1 local_b8 [4];
  int i_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_1;
  vector<int,_std::allocator<int>_> index_1;
  int p_1;
  int c;
  int local_54;
  undefined1 local_50 [4];
  int i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str;
  vector<int,_std::allocator<int>_> index;
  int p;
  int i;
  Function *func_local;
  ostream *os_local;
  
  std::operator<<(os,"Vars: [");
  for (index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      sVar3 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::size
                        (&func->parents_),
      (ulong)(long)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ < sVar3;
      index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    ppNVar4 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                        (&func->parents_,
                         (long)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_);
    psVar5 = NamedVar::name_abi_cxx11_(*ppNVar4);
    poVar6 = std::operator<<(os,(string *)psVar5);
    sVar3 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::size
                      (&func->parents_);
    pcVar13 = ", ";
    if ((long)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ == sVar3 - 1) {
      pcVar13 = " -> ";
    }
    std::operator<<(poVar6,pcVar13);
  }
  psVar5 = NamedVar::name_abi_cxx11_(func->child_);
  poVar6 = std::operator<<(os,(string *)psVar5);
  poVar6 = std::operator<<(poVar6,"]");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  sVar3 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(&func->values_);
  if (sVar3 == 0) {
    for (index_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._0_4_ = 0;
        sVar3 = std::
                vector<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                ::size(&func->map_),
        (ulong)(long)(int)index_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage < sVar3;
        index_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             (int)index_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      Variable::ComputeIndexVec
                ((vector<int,_std::allocator<int>_> *)
                 &str_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&func->parents_,
                 (int)index_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b8);
      for (local_bc = 0;
          sVar3 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)
                             &str_1.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage),
          (ulong)(long)local_bc < sVar3; local_bc = local_bc + 1) {
        ppNVar4 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                            (&func->parents_,(long)local_bc);
        pNVar1 = *ppNVar4;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &str_1.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_bc);
        psVar5 = Variable::GetValue_abi_cxx11_(&pNVar1->super_Variable,*pvVar8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_b8,psVar5);
      }
      poVar6 = std::operator<<(os," ");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&it,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_b8);
      poVar6 = operator<<(poVar6,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&it);
      std::operator<<(poVar6,":");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&it);
      pvVar11 = std::
                vector<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                ::operator[](&func->map_,
                             (long)(int)index_1.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_e0._M_node =
           (_Base_ptr)
           std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           begin(pvVar11);
      while( true ) {
        pvVar11 = std::
                  vector<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                  ::operator[](&func->map_,
                               (long)(int)index_1.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_e8._M_node =
             (_Base_ptr)
             std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             end(pvVar11);
        bVar2 = std::operator!=(&local_e0,&local_e8);
        if (!bVar2) break;
        poVar6 = std::operator<<(os," ");
        this = func->child_;
        ppVar12 = std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->(&local_e0)
        ;
        psVar5 = Variable::GetValue_abi_cxx11_(&this->super_Variable,ppVar12->first);
        poVar6 = std::operator<<(poVar6,(string *)psVar5);
        poVar6 = std::operator<<(poVar6,":");
        ppVar12 = std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->(&local_e0)
        ;
        std::ostream::operator<<(poVar6,ppVar12->second);
        std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator++(&local_e0,0);
      }
      sVar3 = std::
              vector<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
              ::size(&func->map_);
      if ((long)(int)index_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage != sVar3 - 1) {
        std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b8);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &str_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    for (index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._0_4_ = 0;
        sVar3 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::size(&func->values_),
        (ulong)(long)(int)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage < sVar3;
        index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             (int)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      Variable::ComputeIndexVec
                ((vector<int,_std::allocator<int>_> *)
                 &str.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&func->parents_,
                 (int)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
      for (local_54 = 0; uVar7 = (ulong)local_54,
          sVar3 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)
                             &str.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar7 < sVar3;
          local_54 = local_54 + 1) {
        ppNVar4 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                            (&func->parents_,(long)local_54);
        pNVar1 = *ppNVar4;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &str.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_54);
        psVar5 = Variable::GetValue_abi_cxx11_(&pNVar1->super_Variable,*pvVar8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_50,psVar5);
      }
      poVar6 = std::operator<<(os," ");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&p_1,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_50);
      poVar6 = operator<<(poVar6,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&p_1);
      std::operator<<(poVar6,":");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&p_1);
      index_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
      while( true ) {
        pvVar9 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&func->values_,
                              (long)(int)index.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage);
        sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar9);
        if (sVar3 <= (ulong)(long)index_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_) break;
        pvVar9 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&func->values_,
                              (long)(int)index.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (pvVar9,(long)index_1.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        if ((*pvVar10 != 0.0) || (NAN(*pvVar10))) {
          poVar6 = std::operator<<(os," ");
          psVar5 = Variable::GetValue_abi_cxx11_
                             (&func->child_->super_Variable,
                              index_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._4_4_);
          poVar6 = std::operator<<(poVar6,(string *)psVar5);
          poVar6 = std::operator<<(poVar6,":");
          pvVar9 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&func->values_,
                                (long)(int)index.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (pvVar9,(long)index_1.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)
          ;
          std::ostream::operator<<(poVar6,*pvVar10);
        }
        index_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             index_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ + 1;
      }
      sVar3 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(&func->values_);
      if ((long)(int)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage != sVar3 - 1) {
        std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_50);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &str.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const Function& func) {
	os << "Vars: [";
	for (int i = 0; i < func.parents_.size(); i++) {
		os << func.parents_[i]->name()
			<< (i == func.parents_.size() - 1 ? " -> " : ", ");
	}
	os << func.child_->name() << "]" << endl; // TODO: should print curr_name here but prev_name above for state variable

	if (func.values_.size() > 0) {
		for (int p = 0; p < func.values_.size(); p++) {
			vector<int> index = Variable::ComputeIndexVec(func.parents_, p);
			vector<string> str;
			for (int i = 0; i < index.size(); i++)
				str.push_back(func.parents_[i]->GetValue(index[i]));
			os << " " << str << ":";
			for (int c = 0; c < func.values_[p].size(); c++) {
				if (func.values_[p][c] != 0)
					os << " " << func.child_->GetValue(c) << ":"
						<< func.values_[p][c];
			}
			if (p != func.values_.size() - 1)
				os << endl;
		}
	} else {
		for (int p = 0; p < func.map_.size(); p++) {
			vector<int> index = Variable::ComputeIndexVec(func.parents_, p);
			vector<string> str;
			for (int i = 0; i < index.size(); i++)
				str.push_back(func.parents_[i]->GetValue(index[i]));
			os << " " << str << ":";

			for (map<int, double>::const_iterator it = func.map_[p].begin();
				it != func.map_[p].end(); it++) {
				os << " " << func.child_->GetValue(it->first) << ":"
					<< it->second;
			}
			if (p != func.map_.size() - 1)
				os << endl;
		}
	}
	return os;
}